

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::OperatorShaderEvaluator::evaluate
          (OperatorShaderEvaluator *this,ShaderEvalContext *ctx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  (*this->m_evalFunc)(ctx);
  fVar1 = this->m_scale;
  fVar2 = this->m_bias;
  fVar3 = (ctx->color).m_data[1];
  fVar4 = (ctx->color).m_data[2];
  fVar5 = (ctx->color).m_data[3];
  (ctx->color).m_data[0] = fVar2 + (ctx->color).m_data[0] * fVar1;
  (ctx->color).m_data[1] = fVar2 + fVar3 * fVar1;
  (ctx->color).m_data[2] = fVar2 + fVar4 * fVar1;
  (ctx->color).m_data[3] = fVar2 + fVar5 * fVar1;
  return;
}

Assistant:

virtual void evaluate (ShaderEvalContext& ctx)
	{
		m_evalFunc(ctx);
		ctx.color = ctx.color * m_scale + m_bias;
	}